

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel.h
# Opt level: O2

void __thiscall CTextRender::CTextRender(CTextRender *this)

{
  (this->super_IEngineTextRender).super_ITextRender.super_IInterface.m_pKernel = (IKernel *)0x0;
  this->m_pGraphics = (IGraphics *)0x0;
  (this->super_IEngineTextRender).super_ITextRender.super_IInterface._vptr_IInterface =
       (_func_int **)&PTR__IInterface_00206800;
  this->m_TextR = 1.0;
  this->m_TextG = 1.0;
  this->m_TextB = 1.0;
  this->m_TextA = 1.0;
  this->m_TextSecondaryR = 0.0;
  this->m_TextSecondaryG = 0.0;
  this->m_TextSecondaryB = 0.0;
  this->m_TextSecondaryA = 0.3;
  this->m_pGlyphMap = (CGlyphMap *)0x0;
  this->m_NumVariants = 0;
  this->m_CurrentVariant = -1;
  this->m_paVariants = (CFontLanguageVariant *)0x0;
  mem_zero(this->m_apFontData,0x80);
  return;
}

Assistant:

IInterface() : m_pKernel(0) {}